

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

int aec_encode_end(aec_stream *strm)

{
  int iVar1;
  
  iVar1 = 0;
  if (strm->state->flush == 1) {
    iVar1 = (uint)(strm->state->flushed != 0) * 2 + -2;
  }
  cleanup((EVP_PKEY_CTX *)strm);
  return iVar1;
}

Assistant:

int aec_encode_end(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;
    int status;

    status = AEC_OK;
    if (state->flush == AEC_FLUSH && state->flushed == 0)
        status = AEC_STREAM_ERROR;
    cleanup(strm);
    return status;
}